

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleQueue.hpp
# Opt level: O1

void __thiscall
gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::push<helics::ActionMessage>
          (SimpleQueue<helics::ActionMessage,_std::mutex> *this,ActionMessage *val)

{
  pointer pAVar1;
  pointer pAVar2;
  unique_lock<std::mutex> pushLock;
  unique_lock<std::mutex> pullLock;
  unique_lock<std::mutex> local_40;
  unique_lock<std::mutex> local_30;
  
  local_40._M_owns = false;
  local_40._M_device = &this->m_pushLock;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  if ((this->pushElements).
      super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->pushElements).
      super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::unique_lock<std::mutex>::unlock(&local_40);
    local_30._M_device = &this->m_pullLock;
    local_30._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_30);
    local_30._M_owns = true;
    pAVar1 = (this->pullElements).
             super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar2 = (this->pullElements).
             super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pAVar1 == pAVar2) {
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
      emplace_back<helics::ActionMessage>(&this->pullElements,val);
      LOCK();
      (this->queueEmptyFlag)._M_base._M_i = false;
      UNLOCK();
    }
    else {
      std::unique_lock<std::mutex>::lock(&local_40);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
    if (pAVar1 == pAVar2) goto LAB_00307c63;
  }
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
  emplace_back<helics::ActionMessage>(&this->pushElements,val);
LAB_00307c63:
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void push(Z&& val)  // forwarding reference
        {
            std::unique_lock<MUTEX> pushLock(
                m_pushLock);  // only one lock on this branch
            if (pushElements.empty()) {
                pushLock.unlock();
                std::unique_lock<MUTEX> pullLock(m_pullLock);  // first pullLock
                if (pullElements.empty()) {
                    pullElements.push_back(std::forward<Z>(val));
                    queueEmptyFlag.store(false);
                    return;
                }
                // reengage the push lock so we can push next
                // LCOV_EXCL_START
                pushLock.lock();
                // LCOV_EXCL_STOP
            }
            pushElements.push_back(std::forward<Z>(val));
        }